

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLException::XMLException
          (XMLException *this,char *srcFile,XMLFileLoc srcLine,MemoryManager *memoryManager)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  
  this->_vptr_XMLException = (_func_int **)&PTR__XMLException_00402248;
  this->fCode = NoError;
  this->fSrcFile = (char *)0x0;
  this->fSrcLine = srcLine;
  this->fMsg = (XMLCh *)0x0;
  this->fMemoryManager = (MemoryManager *)0x0;
  if (memoryManager == (MemoryManager *)0x0) {
    memoryManager = XMLPlatformUtils::fgMemoryManager;
  }
  iVar1 = (*memoryManager->_vptr_MemoryManager[2])(memoryManager);
  this->fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar1);
  pcVar2 = XMLString::replicate(srcFile,(MemoryManager *)CONCAT44(extraout_var,iVar1));
  this->fSrcFile = pcVar2;
  return;
}

Assistant:

XMLException::XMLException( const   char* const     srcFile
                            , const XMLFileLoc      srcLine
                            , MemoryManager* const  memoryManager) :

    fCode(XMLExcepts::NoError)
    , fSrcFile(0)
    , fSrcLine(srcLine)
    , fMsg(0)
    , fMemoryManager(0)
{
    if (!memoryManager)
      fMemoryManager =
        XMLPlatformUtils::fgMemoryManager->getExceptionMemoryManager();
    else
      fMemoryManager = memoryManager->getExceptionMemoryManager();

    fSrcFile = XMLString::replicate(srcFile, fMemoryManager);
}